

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalized_cepstrum_gain_normalization.cc
# Opt level: O0

bool __thiscall
sptk::GeneralizedCepstrumGainNormalization::Run
          (GeneralizedCepstrumGainNormalization *this,
          vector<double,_std::allocator<double>_> *generalized_cepstrum,
          vector<double,_std::allocator<double>_> *normalized_generalized_cepstrum)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double dVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  double z;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  difference_type in_stack_ffffffffffffff50;
  anon_class_8_1_54a3981a __unary_op;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff58;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff78;
  
  if (((((ulong)in_RDI._M_current[3] & 1) != 0) &&
      (sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
      sVar1 == (long)(*(int *)(in_RDI._M_current + 1) + 1))) &&
     (in_RDX != (vector<double,_std::allocator<double>_> *)0x0)) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar1 != (long)(*(int *)(in_RDI._M_current + 1) + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff70._M_current,
                 (size_type)in_RDI._M_current);
    }
    if ((in_RDI._M_current[2] != 0.0) || (NAN(in_RDI._M_current[2]))) {
      __unary_op.z = in_RDI._M_current[2];
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
      __result._M_current = (double *)pow(__unary_op.z * *pvVar2 + 1.0,1.0 / in_RDI._M_current[2]);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
      *pvVar3 = (value_type)__result._M_current;
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
                __result._M_current,(difference_type)__unary_op.z);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                __result._M_current,(difference_type)__unary_op.z);
      std::
      transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::GeneralizedCepstrumGainNormalization::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*)const::__0>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 in_RDI._M_current,in_stack_ffffffffffffff60,__result,__unary_op);
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
      dVar4 = exp(*pvVar2);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
      *pvVar3 = dVar4;
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff48);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff48);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_RDI);
    }
    return true;
  }
  return false;
}

Assistant:

bool GeneralizedCepstrumGainNormalization::Run(
    const std::vector<double>& generalized_cepstrum,
    std::vector<double>* normalized_generalized_cepstrum) const {
  // Check inputs.
  if (!is_valid_ ||
      generalized_cepstrum.size() != static_cast<std::size_t>(num_order_ + 1) ||
      NULL == normalized_generalized_cepstrum) {
    return false;
  }

  // Prepare memories.
  if (normalized_generalized_cepstrum->size() !=
      static_cast<std::size_t>(num_order_ + 1)) {
    normalized_generalized_cepstrum->resize(num_order_ + 1);
  }

  if (0.0 == gamma_) {
    (*normalized_generalized_cepstrum)[0] = std::exp(generalized_cepstrum[0]);
    std::copy(generalized_cepstrum.begin() + 1, generalized_cepstrum.end(),
              normalized_generalized_cepstrum->begin() + 1);
  } else {
    const double z(1.0 + gamma_ * generalized_cepstrum[0]);
    (*normalized_generalized_cepstrum)[0] = std::pow(z, 1.0 / gamma_);
    std::transform(generalized_cepstrum.begin() + 1, generalized_cepstrum.end(),
                   normalized_generalized_cepstrum->begin() + 1,
                   [z](double c) { return c / z; });
  }

  return true;
}